

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

RegOpnd * __thiscall
Lowerer::GenerateForInEnumeratorLoad
          (Lowerer *this,Opnd *forInEnumeratorOpnd,Instr *insertBeforeInstr)

{
  int iVar1;
  Func *func;
  code *pcVar2;
  bool bVar3;
  SymOpnd *this_00;
  StackSym *pSVar4;
  undefined4 *puVar5;
  Func *pFVar6;
  IndirOpnd *pIVar7;
  RegOpnd *dst;
  uint uVar8;
  
  func = insertBeforeInstr->m_func;
  bVar3 = IR::Opnd::IsSymOpnd(forInEnumeratorOpnd);
  if (bVar3) {
    this_00 = IR::Opnd::AsSymOpnd(forInEnumeratorOpnd);
    pSVar4 = IR::Opnd::GetStackSym(&this_00->super_Opnd);
    if ((pSVar4->field_0x19 & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x7059,"(!stackSym->m_allocated)","!stackSym->m_allocated");
      if (!bVar3) goto LAB_00570db9;
      *puVar5 = 0;
    }
    iVar1 = pSVar4->m_offset;
    uVar8 = func->m_forInLoopBaseDepth + iVar1;
    pFVar6 = this->m_func;
    if (pFVar6->m_forInLoopMaxDepth <= uVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x705b,
                         "(func->m_forInLoopBaseDepth + forInLoopLevel < this->m_func->m_forInLoopMaxDepth)"
                         ,
                         "func->m_forInLoopBaseDepth + forInLoopLevel < this->m_func->m_forInLoopMaxDepth"
                        );
      if (!bVar3) {
LAB_00570db9:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      pFVar6 = this->m_func;
      uVar8 = iVar1 + func->m_forInLoopBaseDepth;
    }
    pSVar4->m_offset = uVar8 * 0x58 + pFVar6->m_forInEnumeratorArrayOffset;
    pSVar4->field_0x19 = pSVar4->field_0x19 | 0x10;
  }
  else {
    bVar3 = IR::Opnd::IsIndirOpnd(forInEnumeratorOpnd);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x7061,"(forInEnumeratorOpnd->IsIndirOpnd())",
                         "forInEnumeratorOpnd->IsIndirOpnd()");
      if (!bVar3) goto LAB_00570db9;
      *puVar5 = 0;
    }
    pIVar7 = IR::Opnd::AsIndirOpnd(forInEnumeratorOpnd);
    if (pIVar7->m_offset == 0) {
      pIVar7 = IR::Opnd::AsIndirOpnd(forInEnumeratorOpnd);
      return pIVar7->m_baseOpnd;
    }
  }
  dst = IR::RegOpnd::New(TyUint64,func);
  InsertLea(dst,forInEnumeratorOpnd,insertBeforeInstr);
  return dst;
}

Assistant:

IR::RegOpnd *
Lowerer::GenerateForInEnumeratorLoad(IR::Opnd * forInEnumeratorOpnd, IR::Instr * insertBeforeInstr)
{
    Func * func = insertBeforeInstr->m_func;

    if (forInEnumeratorOpnd->IsSymOpnd())
    {
        StackSym * stackSym = forInEnumeratorOpnd->AsSymOpnd()->GetStackSym();
        Assert(!stackSym->m_allocated);
        uint forInLoopLevel = stackSym->m_offset;
        Assert(func->m_forInLoopBaseDepth + forInLoopLevel < this->m_func->m_forInLoopMaxDepth);
        stackSym->m_offset = this->m_func->m_forInEnumeratorArrayOffset + ((func->m_forInLoopBaseDepth + forInLoopLevel) * sizeof(Js::ForInObjectEnumerator));
        stackSym->m_allocated = true;
    }
    else
    {
        Assert(forInEnumeratorOpnd->IsIndirOpnd());
        if (forInEnumeratorOpnd->AsIndirOpnd()->GetOffset() == 0)
        {
            return forInEnumeratorOpnd->AsIndirOpnd()->GetBaseOpnd();
        }
    }
    IR::RegOpnd * forInEnumeratorRegOpnd = IR::RegOpnd::New(TyMachPtr, func);
    InsertLea(forInEnumeratorRegOpnd, forInEnumeratorOpnd, insertBeforeInstr);
    return forInEnumeratorRegOpnd;
}